

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4_stream.cpp
# Opt level: O2

void __thiscall minibag::LZ4Stream::writeStream(LZ4Stream *this,int action)

{
  char *__ptr;
  int iVar1;
  FILE *__s;
  size_t sVar2;
  BagIOException *pBVar3;
  BagException *pBVar4;
  uint uVar5;
  ulong __n;
  allocator<char> local_51;
  string local_50;
  
  iVar1 = 0;
LAB_0012f87e:
  if (((this->lz4s_).input_left < 1) && (action != 1 || iVar1 == 2)) {
    return;
  }
  iVar1 = roslz4_compress(&this->lz4s_,action);
  switch(iVar1) {
  case 0:
  case 2:
    goto switchD_0012f8c2_caseD_0;
  case -4:
    pBVar3 = (BagIOException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"ROSLZ4_PARAM_ERROR: bad block size",&local_51);
    BagIOException::BagIOException(pBVar3,&local_50);
    __cxa_throw(pBVar3,&BagIOException::typeinfo,std::runtime_error::~runtime_error);
  default:
    pBVar4 = (BagException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Unhandled return code",&local_51);
    BagException::BagException(pBVar4,&local_50);
    __cxa_throw(pBVar4,&BagException::typeinfo,std::runtime_error::~runtime_error);
  case -2:
    break;
  case -1:
    pBVar3 = (BagIOException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"ROSLZ4_ERROR: compression error",&local_51);
    BagIOException::BagIOException(pBVar3,&local_50);
    __cxa_throw(pBVar3,&BagIOException::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((long)(this->lz4s_).output_next - (long)this->buff_ == (long)this->buff_size_) {
    pBVar3 = (BagIOException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"ROSLZ4_OUTPUT_SMALL: output buffer is too small",&local_51);
    BagIOException::BagIOException(pBVar3,&local_50);
    __cxa_throw(pBVar3,&BagIOException::typeinfo,std::runtime_error::~runtime_error);
  }
switchD_0012f8c2_caseD_0:
  __ptr = this->buff_;
  uVar5 = (int)(this->lz4s_).output_next - (int)__ptr;
  if (0 < (int)uVar5) {
    __n = (ulong)(uVar5 & 0x7fffffff);
    __s = (FILE *)Stream::getFilePointer(&this->super_Stream);
    sVar2 = fwrite(__ptr,1,__n,__s);
    if (sVar2 != __n) {
      pBVar4 = (BagException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Problem writing data to disk",&local_51);
      BagException::BagException(pBVar4,&local_50);
      __cxa_throw(pBVar4,&BagException::typeinfo,std::runtime_error::~runtime_error);
    }
    Stream::advanceOffset(&this->super_Stream,__n);
    (this->lz4s_).output_next = this->buff_;
    (this->lz4s_).output_left = this->buff_size_;
  }
  goto LAB_0012f87e;
}

Assistant:

void LZ4Stream::writeStream(int action) {
    int ret = ROSLZ4_OK;
    while (lz4s_.input_left > 0 ||
           (action == ROSLZ4_FINISH && ret != ROSLZ4_STREAM_END)) {
        ret = roslz4_compress(&lz4s_, action);
        switch(ret) {
        case ROSLZ4_OK: break;
        case ROSLZ4_OUTPUT_SMALL:
            if (lz4s_.output_next - buff_ == buff_size_) {
                throw BagIOException("ROSLZ4_OUTPUT_SMALL: output buffer is too small");
            } else {
                // There's data to be written in buff_; this will free up space
                break;
            }
        case ROSLZ4_STREAM_END: break;
        case ROSLZ4_PARAM_ERROR: throw BagIOException("ROSLZ4_PARAM_ERROR: bad block size"); break;
        case ROSLZ4_ERROR: throw BagIOException("ROSLZ4_ERROR: compression error"); break;
        default: throw BagException("Unhandled return code");
        }

        // If output data is ready, write to disk
        int to_write = lz4s_.output_next - buff_;
        if (to_write > 0) {
            if (fwrite(buff_, 1, to_write, getFilePointer()) != static_cast<size_t>(to_write)) {
                throw BagException("Problem writing data to disk");
            }
            advanceOffset(to_write);
            lz4s_.output_next = buff_;
            lz4s_.output_left = buff_size_;
        }
    }
}